

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# poll_set.cpp
# Opt level: O3

bool __thiscall miniros::PollSet::addEvents(PollSet *this,int sock,int events)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  _Base_ptr p_Var3;
  _Base_ptr p_Var4;
  __sighandler_t __handler;
  bool bVar5;
  uint events_00;
  string local_48;
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->socket_info_mutex_);
  if (iVar2 != 0) {
    std::__throw_system_error(iVar2);
  }
  p_Var4 = (this->socket_info_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var4 != (_Base_ptr)0x0) {
    p_Var1 = &(this->socket_info_)._M_t._M_impl.super__Rb_tree_header;
    p_Var3 = &p_Var1->_M_header;
    do {
      if (sock <= (int)p_Var4[1]._M_color) {
        p_Var3 = p_Var4;
      }
      p_Var4 = (&p_Var4->_M_left)[(int)p_Var4[1]._M_color < sock];
    } while (p_Var4 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var3 != p_Var1) && ((int)p_Var3[1]._M_color <= sock)) {
      events_00 = events | *(uint *)((long)&p_Var3[2]._M_right + 4);
      *(uint *)((long)&p_Var3[2]._M_right + 4) = events_00;
      set_events_on_socket(this->epfd_,sock,events_00);
      this->sockets_changed_ = true;
      bVar5 = true;
      signal(this,sock,__handler);
      goto LAB_001ef969;
    }
  }
  if (console::g_initialized == '\0') {
    console::initialize();
  }
  if (addEvents::loc.initialized_ == false) {
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"miniros.poll_set","");
    console::initializeLogLocation(&addEvents::loc,&local_48,Debug);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  if (addEvents::loc.level_ != Debug) {
    console::setLogLocationLevel(&addEvents::loc,Debug);
    console::checkLogLocationEnabled(&addEvents::loc);
  }
  if (addEvents::loc.logger_enabled_ == true) {
    bVar5 = false;
    console::print((FilterBase *)0x0,addEvents::loc.logger_,addEvents::loc.level_,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/poll_set.cpp"
                   ,0x88,"bool miniros::PollSet::addEvents(int, int)",
                   "PollSet: Tried to add events [%d] to fd [%d] which does not exist in this pollset"
                   ,(ulong)(uint)events,(ulong)(uint)sock);
  }
  else {
    bVar5 = false;
  }
LAB_001ef969:
  pthread_mutex_unlock((pthread_mutex_t *)&this->socket_info_mutex_);
  return bVar5;
}

Assistant:

bool PollSet::addEvents(int sock, int events)
{
  std::scoped_lock<std::mutex> lock(socket_info_mutex_);

  M_SocketInfo::iterator it = socket_info_.find(sock);

  if (it == socket_info_.end())
  {
    MINIROS_DEBUG("PollSet: Tried to add events [%d] to fd [%d] which does not exist in this pollset", events, sock);
    return false;
  }

  it->second.events_ |= events;

  set_events_on_socket(epfd_, sock, it->second.events_);

  sockets_changed_ = true;
  signal();

  return true;
}